

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O2

void __thiscall
btMultiBodyPoint2Point::createConstraintRows
          (btMultiBodyPoint2Point *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  btVector3 *x;
  btVector3 *x_00;
  btScalar upperLimit;
  int iVar1;
  btRigidBody *pbVar2;
  btMultiBody *pbVar3;
  btMultiBodySolverConstraint *solverConstraint;
  int i;
  long lVar4;
  float fVar5;
  float fVar6;
  ulong uVar7;
  btVector3 bVar8;
  btVector3 local_78;
  btVector3 local_68;
  btVector3 local_58;
  btAlignedObjectArray<btMultiBodySolverConstraint> *local_40;
  btContactSolverInfo *local_38;
  
  x = &this->m_pivotInA;
  x_00 = &this->m_pivotInB;
  lVar4 = 0;
  local_40 = constraintRows;
  local_38 = infoGlobal;
  do {
    if (lVar4 == 3) {
      return;
    }
    solverConstraint =
         btAlignedObjectArray<btMultiBodySolverConstraint>::expandNonInitializing(local_40);
    solverConstraint->m_orgConstraint = &this->super_btMultiBodyConstraint;
    solverConstraint->m_orgDofIndex = (int)lVar4;
    (solverConstraint->m_relpos1CrossNormal).m_floats[0] = 0.0;
    (solverConstraint->m_relpos1CrossNormal).m_floats[1] = 0.0;
    (solverConstraint->m_relpos1CrossNormal).m_floats[2] = 0.0;
    (solverConstraint->m_relpos1CrossNormal).m_floats[3] = 0.0;
    (solverConstraint->m_contactNormal1).m_floats[0] = 0.0;
    (solverConstraint->m_contactNormal1).m_floats[1] = 0.0;
    (solverConstraint->m_contactNormal1).m_floats[2] = 0.0;
    (solverConstraint->m_contactNormal1).m_floats[3] = 0.0;
    (solverConstraint->m_relpos2CrossNormal).m_floats[0] = 0.0;
    (solverConstraint->m_relpos2CrossNormal).m_floats[1] = 0.0;
    (solverConstraint->m_relpos2CrossNormal).m_floats[2] = 0.0;
    (solverConstraint->m_relpos2CrossNormal).m_floats[3] = 0.0;
    (solverConstraint->m_contactNormal2).m_floats[0] = 0.0;
    (solverConstraint->m_contactNormal2).m_floats[1] = 0.0;
    (solverConstraint->m_contactNormal2).m_floats[2] = 0.0;
    (solverConstraint->m_contactNormal2).m_floats[3] = 0.0;
    (solverConstraint->m_angularComponentA).m_floats[0] = 0.0;
    (solverConstraint->m_angularComponentA).m_floats[1] = 0.0;
    (solverConstraint->m_angularComponentA).m_floats[2] = 0.0;
    (solverConstraint->m_angularComponentA).m_floats[3] = 0.0;
    (solverConstraint->m_angularComponentB).m_floats[0] = 0.0;
    (solverConstraint->m_angularComponentB).m_floats[1] = 0.0;
    (solverConstraint->m_angularComponentB).m_floats[2] = 0.0;
    (solverConstraint->m_angularComponentB).m_floats[3] = 0.0;
    iVar1 = data->m_fixedBodyId;
    solverConstraint->m_solverBodyIdA = iVar1;
    solverConstraint->m_solverBodyIdB = iVar1;
    local_58.m_floats[0] = 0.0;
    local_58.m_floats[1] = 0.0;
    local_58.m_floats[2] = 0.0;
    local_58.m_floats[3] = 0.0;
    local_58.m_floats[lVar4] = -1.0;
    local_68.m_floats._0_8_ = *(undefined8 *)x->m_floats;
    local_68.m_floats._8_8_ = *(undefined8 *)((this->m_pivotInA).m_floats + 2);
    pbVar2 = this->m_rigidBodyA;
    if (pbVar2 == (btRigidBody *)0x0) {
      pbVar3 = (this->super_btMultiBodyConstraint).m_bodyA;
      if (pbVar3 != (btMultiBody *)0x0) {
        bVar8 = btMultiBody::localPosToWorld(pbVar3,(this->super_btMultiBodyConstraint).m_linkA,x);
        local_68.m_floats._8_8_ = bVar8.m_floats._8_8_;
        local_68.m_floats[0] = bVar8.m_floats[0];
        local_68.m_floats[1] = bVar8.m_floats[1];
        goto LAB_00192c9c;
      }
    }
    else {
      solverConstraint->m_solverBodyIdA = (pbVar2->super_btCollisionObject).m_companionId;
      bVar8 = btTransform::operator()(&(pbVar2->super_btCollisionObject).m_worldTransform,x);
      local_68.m_floats._8_8_ = bVar8.m_floats._8_8_;
      local_68.m_floats[0] = bVar8.m_floats[0];
      local_68.m_floats[1] = bVar8.m_floats[1];
LAB_00192c9c:
    }
    local_78.m_floats._0_8_ = *(undefined8 *)x_00->m_floats;
    local_78.m_floats._8_8_ = *(undefined8 *)((this->m_pivotInB).m_floats + 2);
    pbVar2 = this->m_rigidBodyB;
    if (pbVar2 == (btRigidBody *)0x0) {
      pbVar3 = (this->super_btMultiBodyConstraint).m_bodyB;
      if (pbVar3 != (btMultiBody *)0x0) {
        bVar8 = btMultiBody::localPosToWorld
                          (pbVar3,(this->super_btMultiBodyConstraint).m_linkB,x_00);
        uVar7 = bVar8.m_floats._8_8_;
        fVar5 = bVar8.m_floats[0];
        fVar6 = bVar8.m_floats[1];
        goto LAB_00192ceb;
      }
      fVar5 = local_78.m_floats[0];
      fVar6 = local_78.m_floats[1];
      uVar7 = local_78.m_floats._8_8_ & 0xffffffff;
    }
    else {
      solverConstraint->m_solverBodyIdB = (pbVar2->super_btCollisionObject).m_companionId;
      bVar8 = btTransform::operator()(&(pbVar2->super_btCollisionObject).m_worldTransform,x_00);
      uVar7 = bVar8.m_floats._8_8_;
      fVar5 = bVar8.m_floats[0];
      fVar6 = bVar8.m_floats[1];
LAB_00192ceb:
      local_78.m_floats[1] = fVar6;
      local_78.m_floats[0] = fVar5;
      local_78.m_floats._8_8_ = uVar7;
    }
    upperLimit = (this->super_btMultiBodyConstraint).m_maxAppliedImpulse;
    btMultiBodyConstraint::fillMultiBodyConstraint
              (&this->super_btMultiBodyConstraint,solverConstraint,data,(btScalar *)0x0,
               (btScalar *)0x0,&local_58,&local_68,&local_78,
               (local_68.m_floats[2] - (float)uVar7) * local_58.m_floats[2] +
               (local_68.m_floats[0] - fVar5) * local_58.m_floats[0] +
               (local_68.m_floats[1] - fVar6) * local_58.m_floats[1],local_38,-upperLimit,upperLimit
               ,1.0,false,0.0,0.0);
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void btMultiBodyPoint2Point::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{

//	int i=1;
int numDim = BTMBP2PCONSTRAINT_DIM;
	for (int i=0;i<numDim;i++)
	{

		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();
        //memset(&constraintRow,0xffffffff,sizeof(btMultiBodySolverConstraint));
	constraintRow.m_orgConstraint = this;
	constraintRow.m_orgDofIndex = i;
        constraintRow.m_relpos1CrossNormal.setValue(0,0,0);
        constraintRow.m_contactNormal1.setValue(0,0,0);
        constraintRow.m_relpos2CrossNormal.setValue(0,0,0);
        constraintRow.m_contactNormal2.setValue(0,0,0);
        constraintRow.m_angularComponentA.setValue(0,0,0);
        constraintRow.m_angularComponentB.setValue(0,0,0);

		constraintRow.m_solverBodyIdA = data.m_fixedBodyId;
		constraintRow.m_solverBodyIdB = data.m_fixedBodyId;

		btVector3 contactNormalOnB(0,0,0);
#ifndef BTMBP2PCONSTRAINT_BLOCK_ANGULAR_MOTION_TEST
		contactNormalOnB[i] = -1;
#else
		contactNormalOnB[i%3] = -1;
#endif


		 // Convert local points back to world
		btVector3 pivotAworld = m_pivotInA;
		if (m_rigidBodyA)
		{

			constraintRow.m_solverBodyIdA = m_rigidBodyA->getCompanionId();
			pivotAworld = m_rigidBodyA->getCenterOfMassTransform()*m_pivotInA;
		} else
		{
			if (m_bodyA)
				pivotAworld = m_bodyA->localPosToWorld(m_linkA, m_pivotInA);
		}
		btVector3 pivotBworld = m_pivotInB;
		if (m_rigidBodyB)
		{
			constraintRow.m_solverBodyIdB = m_rigidBodyB->getCompanionId();
			pivotBworld = m_rigidBodyB->getCenterOfMassTransform()*m_pivotInB;
		} else
		{
			if (m_bodyB)
				pivotBworld = m_bodyB->localPosToWorld(m_linkB, m_pivotInB);

		}

		btScalar posError = i < 3 ? (pivotAworld-pivotBworld).dot(contactNormalOnB) : 0;

#ifndef BTMBP2PCONSTRAINT_BLOCK_ANGULAR_MOTION_TEST


		fillMultiBodyConstraint(constraintRow, data, 0, 0,
															contactNormalOnB, pivotAworld, pivotBworld,						//sucks but let it be this way "for the time being"
															posError,
															infoGlobal,
															-m_maxAppliedImpulse, m_maxAppliedImpulse
															);
    //@todo: support the case of btMultiBody versus btRigidBody,
    //see btPoint2PointConstraint::getInfo2NonVirtual
#else
		const btVector3 dummy(0, 0, 0);

		btAssert(m_bodyA->isMultiDof());

		btScalar* jac1 = jacobianA(i);
		const btVector3 &normalAng = i >= 3 ? contactNormalOnB : dummy;
		const btVector3 &normalLin = i < 3 ? contactNormalOnB : dummy;

		m_bodyA->filConstraintJacobianMultiDof(m_linkA, pivotAworld, normalAng, normalLin, jac1, data.scratch_r, data.scratch_v, data.scratch_m);

		fillMultiBodyConstraint(constraintRow, data, jac1, 0,
													dummy, dummy, dummy,						//sucks but let it be this way "for the time being"
													posError,
													infoGlobal,
													-m_maxAppliedImpulse, m_maxAppliedImpulse
													);
#endif
	}
}